

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O2

TestCaseGroup * vkt::synchronization::createBasicEventTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> basicTests;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"event","Basic event tests");
  basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"host_set_reset",&local_61)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Basic event tests set and reset on host",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::hostResetSetEventCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"device_set_reset",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Basic event tests set and reset on device",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::deviceResetSetEventCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"host_set_device_wait",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Wait for event on device test",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::deviceWaitForEventCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"single_submit_multi_command_buffer",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Wait and set event single submission on device",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::singleSubmissionCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"multi_submit_multi_command_buffer",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Wait and set event mutli submission on device",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::multiSubmissionCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"multi_secondary_command_buffer",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Event used on secondary command buffer ",&local_62);
  addFunctionCase(pTVar1,&local_40,&local_60,anon_unknown_0::secondaryCommandBufferCase);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  basicTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&basicTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createBasicEventTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicTests(new tcu::TestCaseGroup(testCtx, "event", "Basic event tests"));
	addFunctionCase(basicTests.get(), "host_set_reset",   "Basic event tests set and reset on host", hostResetSetEventCase);
	addFunctionCase(basicTests.get(), "device_set_reset", "Basic event tests set and reset on device", deviceResetSetEventCase);
	addFunctionCase(basicTests.get(), "host_set_device_wait", "Wait for event on device test", deviceWaitForEventCase);
	addFunctionCase(basicTests.get(), "single_submit_multi_command_buffer", "Wait and set event single submission on device", singleSubmissionCase);
	addFunctionCase(basicTests.get(), "multi_submit_multi_command_buffer", "Wait and set event mutli submission on device", multiSubmissionCase);
	addFunctionCase(basicTests.get(), "multi_secondary_command_buffer", "Event used on secondary command buffer ", secondaryCommandBufferCase);

	return basicTests.release();
}